

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

Wlc_Ntk_t * Wlc_NtkDupDfsAbs(Wlc_Ntk_t *p,Vec_Int_t *vPisOld,Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  undefined1 *puVar1;
  ushort uVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *pVVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  char *__dest;
  uint uVar10;
  ushort uVar11;
  long lVar12;
  
  uVar10 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar10) {
    piVar5 = (p->vCopies).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar10 << 2);
    }
    (p->vCopies).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset((p->vCopies).pArray,0,(ulong)uVar10 * 4);
  }
  (p->vCopies).nSize = uVar10;
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = p->fAsyncRst;
  pNew->fMemPorts = p->fMemPorts;
  pNew->fEasyFfs = p->fEasyFfs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar6->pArray = piVar5;
  if (0 < vPisOld->nSize) {
    lVar12 = 0;
    do {
      iVar3 = vPisOld->pArray[lVar12];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[iVar3] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x1) {
        __assert_fail("Wlc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x430,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Wlc_ObjDup(pNew,p,iVar3,pVVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vPisOld->nSize);
  }
  if (0 < vPisNew->nSize) {
    lVar12 = 0;
    do {
      lVar7 = (long)vPisNew->pArray[lVar12];
      if ((lVar7 < 1) || (p->nObjsAlloc <= vPisNew->pArray[lVar12])) goto LAB_0036ec52;
      uVar2 = *(ushort *)(p->pObjs + lVar7);
      uVar11 = uVar2 & 0x3f;
      if (uVar11 == 1) {
        __assert_fail("!Wlc_ObjIsPi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x438,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pWVar4 = p->pObjs + lVar7;
      uVar10 = pWVar4->nFanins;
      *(ushort *)pWVar4 = (uVar2 & 0xffc0) + 1;
      pWVar4->nFanins = 0;
      Wlc_ObjDup(pNew,p,(int)((ulong)((long)pWVar4 - (long)p->pObjs) >> 3) * -0x55555555,pVVar6);
      *(ushort *)pWVar4 = uVar11 | (ushort)*(undefined4 *)pWVar4 & 0xffc0;
      pWVar4->nFanins = uVar10;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vPisNew->nSize);
  }
  if (0 < vFlops->nSize) {
    lVar12 = 0;
    do {
      iVar3 = vFlops->pArray[lVar12];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      if (((undefined1  [24])((undefined1  [24])p->pObjs[iVar3] & (undefined1  [24])0x3f) ==
           (undefined1  [24])0x1) ||
         ((undefined1  [24])((undefined1  [24])p->pObjs[iVar3] & (undefined1  [24])0x3d) !=
          (undefined1  [24])0x1)) {
        __assert_fail("!Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                      ,0x442,
                      "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Wlc_ObjDup(pNew,p,iVar3,pVVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vFlops->nSize);
  }
  if (0 < (p->vPos).nSize) {
    lVar12 = 0;
    do {
      iVar3 = (p->vPos).pArray[lVar12];
      if ((iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      Wlc_NtkDupDfs_rec(pNew,p,iVar3,pVVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->vPos).nSize);
  }
  if (0 < vFlops->nSize) {
    lVar12 = 0;
    do {
      lVar7 = (long)vFlops->pArray[lVar12];
      if ((lVar7 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar12])) goto LAB_0036ec52;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar7] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) goto LAB_0036ec90;
      uVar10 = (p->pObjs[lVar7].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar10 < 0) || ((p->vCos).nSize <= (int)uVar10)) goto LAB_0036ec71;
      iVar3 = (p->vCos).pArray[uVar10];
      if ((iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      Wlc_NtkDupDfs_rec(pNew,p,iVar3,pVVar6);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vFlops->nSize);
  }
  if (0 < (p->vPos).nSize) {
    lVar12 = 0;
    do {
      iVar3 = (p->vPos).pArray[lVar12];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      if ((p->vCopies).nSize <= iVar3) goto LAB_0036ec71;
      iVar3 = (p->vCopies).pArray[iVar3];
      if (((long)iVar3 < 1) || (pNew->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      Wlc_ObjSetCo(pNew,pNew->pObjs + iVar3,0);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->vPos).nSize);
  }
  if (0 < vFlops->nSize) {
    lVar12 = 0;
    do {
      lVar7 = (long)vFlops->pArray[lVar12];
      if ((lVar7 < 1) || (p->nObjsAlloc <= vFlops->pArray[lVar12])) goto LAB_0036ec52;
      if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar7] & (undefined1  [24])0x3f) !=
          (undefined1  [24])0x3) {
LAB_0036ec90:
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar10 = (p->pObjs[lVar7].field_10.Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar10 < 0) || ((p->vCos).nSize <= (int)uVar10)) {
LAB_0036ec71:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = (p->vCos).pArray[uVar10];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      if ((p->vCopies).nSize <= iVar3) goto LAB_0036ec71;
      iVar3 = (p->vCopies).pArray[iVar3];
      if (((long)iVar3 < 1) || (pNew->nObjsAlloc <= iVar3)) goto LAB_0036ec52;
      pWVar4 = pNew->pObjs;
      Vec_IntPush(&pNew->vCos,iVar3);
      puVar1 = &pWVar4[iVar3].field_0x1;
      *puVar1 = *puVar1 | 4;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vFlops->nSize);
  }
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  free(pVVar6);
  if (0 < vFlops->nSize) {
    lVar12 = 0;
    do {
      iVar3 = vFlops->pArray[lVar12];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
LAB_0036ec52:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      *(ushort *)(p->pObjs + iVar3) = *(ushort *)(p->pObjs + iVar3) | 0x80;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vFlops->nSize);
  }
  if (p->vInits != (Vec_Int_t *)0x0) {
    pVVar6 = Wlc_ReduceMarkedInitVec(p,p->vInits);
    pNew->vInits = pVVar6;
  }
  if (p->pInits != (char *)0x0) {
    pcVar8 = Wlc_ReduceMarkedInitStr(p,p->pInits);
    pNew->pInits = pcVar8;
  }
  Wlc_NtkCleanMarks(p);
  pcVar8 = p->pSpec;
  if (pcVar8 != (char *)0x0) {
    sVar9 = strlen(pcVar8);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,pcVar8);
    pNew->pSpec = __dest;
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfsAbs( Wlc_Ntk_t * p, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;

    // duplicate marked PIs
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vPisOld, p, pObj, i )
    {
        assert( Wlc_ObjIsPi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }
    // duplicate additional PIs
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
    {
        unsigned Type = pObj->Type;
        int nFanins = Wlc_ObjFaninNum(pObj);
        assert( !Wlc_ObjIsPi(pObj) );
        pObj->Type = WLC_OBJ_PI;
        pObj->nFanins = 0;
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
        pObj->Type = Type;
        pObj->nFanins = (unsigned)nFanins;
    }
    // duplicate flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
    {
        assert( !Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }

    // duplicate logic cones of primary outputs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    // duplidate logic cone of flop inputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj)), vFanins );

    // duplicate POs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), 0 );
    // duplicate flop inputs 
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, Wlc_ObjFo2Fi(p, pObj)), 1 );
    Vec_IntFree( vFanins );

    // mark flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        pObj->Mark = 1;
    if ( p->vInits )
        pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
    if ( p->pInits )
        pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
    Wlc_NtkCleanMarks( p );

    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    //Wlc_NtkTransferNames( pNew, p );
    return pNew;
}